

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yin.c
# Opt level: O3

void yin_print_restr(lyout *out,int level,lys_module *module,lys_restr *restr,int *flag)

{
  byte bVar1;
  char *pcVar2;
  
  bVar1 = restr->ext_size;
  if (bVar1 != 0) {
    if ((flag != (int *)0x0) && (*flag == 0)) {
      *flag = 1;
      ly_print(out,">\n");
      bVar1 = restr->ext_size;
    }
    yin_print_extension_instances(out,level,module,LYEXT_SUBSTMT_SELF,'\0',restr->ext,(uint)bVar1);
  }
  if (*restr->expr == '\x15') {
    if ((flag != (int *)0x0) && (*flag == 0)) {
      *flag = 1;
      ly_print(out,">\n");
    }
    yin_print_substmt(out,level,LYEXT_SUBSTMT_MODIFIER,'\0',"invert-match",module,restr->ext,
                      (uint)restr->ext_size);
  }
  pcVar2 = restr->emsg;
  if (pcVar2 != (char *)0x0) {
    if ((flag != (int *)0x0) && (*flag == 0)) {
      *flag = 1;
      ly_print(out,">\n");
      pcVar2 = restr->emsg;
    }
    yin_print_substmt(out,level,LYEXT_SUBSTMT_ERRMSG,'\0',pcVar2,module,restr->ext,
                      (uint)restr->ext_size);
  }
  pcVar2 = restr->eapptag;
  if (pcVar2 != (char *)0x0) {
    if ((flag != (int *)0x0) && (*flag == 0)) {
      *flag = 1;
      ly_print(out,">\n");
      pcVar2 = restr->eapptag;
    }
    yin_print_substmt(out,level,LYEXT_SUBSTMT_ERRTAG,'\0',pcVar2,module,restr->ext,
                      (uint)restr->ext_size);
  }
  pcVar2 = restr->dsc;
  if (pcVar2 != (char *)0x0) {
    if ((flag != (int *)0x0) && (*flag == 0)) {
      *flag = 1;
      ly_print(out,">\n");
      pcVar2 = restr->dsc;
    }
    yin_print_substmt(out,level,LYEXT_SUBSTMT_DESCRIPTION,'\0',pcVar2,module,restr->ext,
                      (uint)restr->ext_size);
  }
  pcVar2 = restr->ref;
  if (pcVar2 != (char *)0x0) {
    if ((flag != (int *)0x0) && (*flag == 0)) {
      *flag = 1;
      ly_print(out,">\n");
      pcVar2 = restr->ref;
    }
    yin_print_substmt(out,level,LYEXT_SUBSTMT_REFERENCE,'\0',pcVar2,module,restr->ext,
                      (uint)restr->ext_size);
  }
  return;
}

Assistant:

static void
yin_print_restr(struct lyout *out, int level, const struct lys_module *module, const struct lys_restr *restr,
                    int *flag)
{
    if (restr->ext_size) {
        yin_print_close_parent(out, flag);
        yin_print_extension_instances(out, level, module, LYEXT_SUBSTMT_SELF, 0,
                                      restr->ext, restr->ext_size);
    }
    if (restr->expr[0] == 0x15) {
        /* special byte value in pattern's expression: 0x15 - invert-match, 0x06 - match */
        yin_print_close_parent(out, flag);
        yin_print_substmt(out, level, LYEXT_SUBSTMT_MODIFIER, 0, "invert-match", module,
                          restr->ext, restr->ext_size);
    }
    if (restr->emsg != NULL) {
        yin_print_close_parent(out, flag);
        yin_print_substmt(out, level, LYEXT_SUBSTMT_ERRMSG, 0, restr->emsg,
                          module, restr->ext, restr->ext_size);
    }
    if (restr->eapptag != NULL) {
        yin_print_close_parent(out, flag);
        yin_print_substmt(out, level, LYEXT_SUBSTMT_ERRTAG, 0, restr->eapptag,
                          module, restr->ext, restr->ext_size);
    }
    if (restr->dsc != NULL) {
        yin_print_close_parent(out, flag);
        yin_print_substmt(out, level, LYEXT_SUBSTMT_DESCRIPTION, 0, restr->dsc,
                          module, restr->ext, restr->ext_size);
    }
    if (restr->ref != NULL) {
        yin_print_close_parent(out, flag);
        yin_print_substmt(out, level, LYEXT_SUBSTMT_REFERENCE, 0, restr->ref,
                          module, restr->ext, restr->ext_size);
    }
}